

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

string * chapter2::max(string *__return_storage_ptr__,string *parray,int size)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  pbVar1 = std::__max_element<std::__cxx11::string_const*,__gnu_cxx::__ops::_Iter_less_iter>
                     (parray,parray + size);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
  return __return_storage_ptr__;
}

Assistant:

string max(const string *parray, int size) {
        return *max_element(parray, parray + size);
    }